

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Svd.h
# Opt level: O2

double __thiscall
singular::Svd<60,_50>::BidiagonalMatrix::applyRotatorFromRight
          (BidiagonalMatrix *this,Rotator *r,int n,double bulge)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  long lVar9;
  
  pdVar6 = this->pBlock;
  lVar9 = (long)(n * 2);
  dVar1 = pdVar6[lVar9 + 1];
  dVar2 = pdVar6[lVar9 + 2];
  dVar7 = r->elements[0];
  dVar3 = r->elements[2];
  dVar4 = r->elements[3];
  dVar8 = (pdVar6 + lVar9 + -1)[1];
  dVar5 = r->elements[1];
  pdVar6[lVar9 + -1] = dVar7 * pdVar6[lVar9 + -1] + bulge * dVar3;
  (pdVar6 + lVar9 + -1)[1] = dVar7 * dVar8 + dVar1 * dVar3;
  pdVar6[lVar9 + 1] = dVar1 * dVar4 + dVar8 * dVar5;
  pdVar6[lVar9 + 2] = dVar4 * dVar2;
  return dVar2 * dVar3;
}

Assistant:

double applyRotatorFromRight(
				const Rotator& r, int n, double bulge)
			{
				double* p = this->pBlock + n * 2;
				double g0 = p[-1];
				double b1 = p[0];
				double g1 = p[1];
				double b2 = p[2];
				double r11 = r(0, 0);
				double r12 = r(0, 1);
				double r21 = r(1, 0);
				double r22 = r(1, 1);
				p[-1] = g0 * r11 + bulge * r21;
				p[0] = b1 * r11 + g1 * r21;
				p[1] = b1 * r12 + g1 * r22;
				p[2] = b2 * r22;
				return b2 * r21;
			}